

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

int GetMonitorPhysicalHeight(int monitor)

{
  GLFWmonitor **ppGVar1;
  int height;
  int monitorCount;
  int local_10;
  int local_c;
  
  local_10 = 0;
  local_c = 0;
  ppGVar1 = glfwGetMonitors(&local_c);
  if ((monitor < 0) || (local_c <= monitor)) {
    TraceLog(4,"GLFW: Failed to find selected monitor");
  }
  else {
    glfwGetMonitorPhysicalSize(ppGVar1[(uint)monitor],(int *)0x0,&local_10);
  }
  return local_10;
}

Assistant:

int GetMonitorPhysicalHeight(int monitor)
{
    int height = 0;
    int monitorCount = 0;
    GLFWmonitor **monitors = glfwGetMonitors(&monitorCount);

    if ((monitor >= 0) && (monitor < monitorCount)) glfwGetMonitorPhysicalSize(monitors[monitor], NULL, &height);
    else TRACELOG(LOG_WARNING, "GLFW: Failed to find selected monitor");

    return height;
}